

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty_printer.hpp
# Opt level: O3

void __thiscall
trial::protocol::json::example::pretty_printer::print_object_element(pretty_printer *this,int count)

{
  basic_reader<char> *this_00;
  bool bVar1;
  value vVar2;
  size_type sVar3;
  error *this_01;
  error_code eVar4;
  error_code ec;
  error_code ec_00;
  view_type key;
  view_type local_40;
  view_type local_30;
  
  vVar2 = basic_reader<char>::symbol(this->reader);
  if (vVar2 == key) {
    if (0 < count) {
      local_40._M_len = 1;
      local_40._M_str = ",";
      basic_writer<char,_16UL>::literal(this->writer,&local_40);
      local_40._M_len = 1;
      local_40._M_str = "\n";
      basic_writer<char,_16UL>::literal(this->writer,&local_40);
    }
    sVar3 = basic_reader<char>::level(this->reader);
    indent(this,(int)sVar3);
    this_00 = this->reader;
    local_40._M_str = (this_00->decoder).current.view.head;
    local_40._M_len = (long)(this_00->decoder).current.view.tail - (long)local_40._M_str;
    bVar1 = basic_reader<char>::next(this_00);
    if (bVar1) {
      basic_writer<char,_16UL>::literal(this->writer,&local_40);
      local_30._M_len = 3;
      local_30._M_str = " : ";
      basic_writer<char,_16UL>::literal(this->writer,&local_30);
      vVar2 = basic_reader<char>::symbol(this->reader);
      if (vVar2 == begin_object) {
        print_object(this,false);
      }
      else if (vVar2 == begin_array) {
        print_array(this,false);
      }
      else {
        print_value(this);
      }
      return;
    }
    this_01 = (error *)__cxa_allocate_exception(0x20);
    eVar4 = make_error_code(invalid_value);
    ec_00._M_cat = eVar4._M_cat;
    ec_00._4_4_ = 0;
    ec_00._M_value = eVar4._M_value;
    error::error(this_01,ec_00);
  }
  else {
    this_01 = (error *)__cxa_allocate_exception(0x20);
    eVar4 = make_error_code(invalid_key);
    ec._M_cat = eVar4._M_cat;
    ec._4_4_ = 0;
    ec._M_value = eVar4._M_value;
    error::error(this_01,ec);
  }
  __cxa_throw(this_01,&error::typeinfo,std::system_error::~system_error);
}

Assistant:

void print_object_element(int count)
    {
        if (reader.symbol() != json::token::symbol::key)
            throw json::error(make_error_code(json::invalid_key));

        // Print value separator
        if (count > 0)
        {
            writer.literal(",");
            newline();
        }

        indent(reader.level());

        json::reader::view_type key = reader.literal();
        if (!reader.next())
            throw json::error(make_error_code(json::invalid_value));

        // Print key
        writer.literal(key);

        // Print key separator
        writer.literal(" : ");

        // Print value
        switch (reader.symbol())
        {
        case json::token::symbol::begin_array:
            print_array(false);
            break;

        case json::token::symbol::begin_object:
            print_object(false);
            break;

        default:
            print_value();
            break;
        }
    }